

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
ArgsManager::GetChainArg_abi_cxx11_
          (variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ArgsManager *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Optional_payload_base<ChainType> _Var6;
  runtime_error *this_00;
  long in_FS_OFFSET;
  string_view chain;
  allocator<char> local_89;
  anon_class_8_1_8991fb9c get_net;
  string local_80;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  chain_arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  get_net.this = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chain_arg,"-regtest",(allocator<char> *)&local_80);
  bVar2 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&get_net,(string *)&chain_arg);
  std::__cxx11::string::~string((string *)&chain_arg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chain_arg,"-signet",(allocator<char> *)&local_80);
  bVar3 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&get_net,(string *)&chain_arg);
  std::__cxx11::string::~string((string *)&chain_arg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chain_arg,"-testnet",(allocator<char> *)&local_80);
  bVar4 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&get_net,(string *)&chain_arg);
  std::__cxx11::string::~string((string *)&chain_arg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chain_arg,"-testnet4",(allocator<char> *)&local_80);
  bVar5 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&get_net,(string *)&chain_arg);
  std::__cxx11::string::~string((string *)&chain_arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"-chain",&local_89);
  GetArg(&chain_arg,this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (1 < (uint)bVar4 + (uint)bVar5 + (uint)bVar3 + (uint)bVar2 +
          (uint)chain_arg.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Invalid combination of -regtest, -signet, -testnet, -testnet4 and -chain. Can use at most one."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0013186f;
  }
  if (chain_arg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    if (bVar2 || bVar3) {
      _Var6._M_payload._M_value = bVar2 | 2;
      _Var6._4_4_ = 0;
    }
    else {
      _Var6._M_payload = (_Storage<ChainType,_true>)0x1;
      _Var6._M_engaged = false;
      _Var6._5_3_ = 0;
      if (!bVar4) {
        _Var6 = (_Optional_payload_base<ChainType>)((ulong)bVar5 << 2);
      }
    }
LAB_00131761:
    *(_Storage<ChainType,_true> *)
     &(__return_storage_ptr__->
      super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u =
         _Var6._M_payload;
    (__return_storage_ptr__->
    super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_index = '\0';
  }
  else {
    chain._M_str = (char *)chain_arg.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p;
    chain._M_len = chain_arg.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length;
    _Var6 = (_Optional_payload_base<ChainType>)ChainTypeFromString(chain);
    if (((ulong)_Var6 >> 0x20 & 1) != 0) goto LAB_00131761;
    std::__detail::__variant::_Variant_storage<false,ChainType,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string_const&>
              ((_Variant_storage<false,ChainType,std::__cxx11::string> *)__return_storage_ptr__,
               &chain_arg);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&chain_arg);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_0013186f:
  __stack_chk_fail();
}

Assistant:

std::variant<ChainType, std::string> ArgsManager::GetChainArg() const
{
    auto get_net = [&](const std::string& arg) {
        LOCK(cs_args);
        common::SettingsValue value = common::GetSetting(m_settings, /* section= */ "", SettingName(arg),
            /* ignore_default_section_config= */ false,
            /*ignore_nonpersistent=*/false,
            /* get_chain_type= */ true);
        return value.isNull() ? false : value.isBool() ? value.get_bool() : InterpretBool(value.get_str());
    };

    const bool fRegTest = get_net("-regtest");
    const bool fSigNet  = get_net("-signet");
    const bool fTestNet = get_net("-testnet");
    const bool fTestNet4 = get_net("-testnet4");
    const auto chain_arg = GetArg("-chain");

    if ((int)chain_arg.has_value() + (int)fRegTest + (int)fSigNet + (int)fTestNet + (int)fTestNet4 > 1) {
        throw std::runtime_error("Invalid combination of -regtest, -signet, -testnet, -testnet4 and -chain. Can use at most one.");
    }
    if (chain_arg) {
        if (auto parsed = ChainTypeFromString(*chain_arg)) return *parsed;
        // Not a known string, so return original string
        return *chain_arg;
    }
    if (fRegTest) return ChainType::REGTEST;
    if (fSigNet) return ChainType::SIGNET;
    if (fTestNet) return ChainType::TESTNET;
    if (fTestNet4) return ChainType::TESTNET4;
    return ChainType::MAIN;
}